

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int modified_get_message_annotations(MODIFIED_HANDLE modified,fields *message_annotations_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE value;
  int get_single_value_result;
  AMQP_VALUE item_value;
  MODIFIED_INSTANCE *modified_instance;
  uint32_t item_count;
  int result;
  fields *message_annotations_value_local;
  MODIFIED_HANDLE modified_local;
  
  if (modified == (MODIFIED_HANDLE)0x0) {
    modified_instance._4_4_ = 0x480a;
  }
  else {
    _item_count = message_annotations_value;
    message_annotations_value_local = &modified->composite_value;
    iVar1 = amqpvalue_get_composite_item_count
                      (modified->composite_value,(uint32_t *)&modified_instance);
    if (iVar1 == 0) {
      if ((uint)modified_instance < 3) {
        modified_instance._4_4_ = 0x4818;
      }
      else {
        value = amqpvalue_get_composite_item_in_place(modified->composite_value,2);
        if ((value == (AMQP_VALUE)0x0) ||
           (AVar2 = amqpvalue_get_type(value), AVar2 == AMQP_TYPE_NULL)) {
          modified_instance._4_4_ = 0x4820;
        }
        else {
          iVar1 = amqpvalue_get_map(value,_item_count);
          if (iVar1 == 0) {
            modified_instance._4_4_ = 0;
          }
          else {
            modified_instance._4_4_ = 0x4827;
          }
        }
      }
    }
    else {
      modified_instance._4_4_ = 0x4812;
    }
  }
  return modified_instance._4_4_;
}

Assistant:

int modified_get_message_annotations(MODIFIED_HANDLE modified, fields* message_annotations_value)
{
    int result;

    if (modified == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        MODIFIED_INSTANCE* modified_instance = (MODIFIED_INSTANCE*)modified;
        if (amqpvalue_get_composite_item_count(modified_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 2)
            {
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(modified_instance->composite_value, 2);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    result = MU_FAILURE;
                }
                else
                {
                    int get_single_value_result = amqpvalue_get_fields(item_value, message_annotations_value);
                    if (get_single_value_result != 0)
                    {
                        result = MU_FAILURE;
                    }
                    else
                    {
                        result = 0;
                    }
                }
            }
        }
    }

    return result;
}